

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::fastcgi::add_value(fastcgi *this,string *value)

{
  ulong uVar1;
  uint uVar2;
  undefined8 in_RAX;
  undefined4 uStack_8;
  uint local_4;
  
  uVar1 = value->_M_string_length;
  if (uVar1 < 0x80) {
    local_4 = (uint)((ulong)in_RAX >> 0x20);
    uStack_8 = CONCAT13((char)uVar1,(int3)in_RAX);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>
              (&this->body_,(char *)((long)&uStack_8 + 3));
  }
  else {
    uVar2 = (uint)uVar1;
    uStack_8 = (undefined4)in_RAX;
    _uStack_8 = CONCAT44((uVar2 | 0x80000000) >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                         (uVar2 & 0xff00) << 8 | uVar2 << 0x18,uStack_8);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)&this->body_,
               (const_iterator)
               (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_4,&stack0x00000000);
  }
  return;
}

Assistant:

void add_value(std::string const &value)
		{
			if(value.size() <128) {
				body_.push_back(char(value.size()));
			}
			else {
				uint32_t size=value.size();
				size |= 0x80000000u;
				size=htonl(size);
				char *p=(char*)&size;
				body_.insert(body_.end(),p,p+sizeof(size));
			}
		}